

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_draw_list_stroke_poly_line
               (nk_draw_list *list,nk_vec2 *points,uint points_count,nk_color color,
               nk_draw_list_stroke closed,float thickness,nk_anti_aliasing aliasing)

{
  nk_convert_config *config;
  undefined8 *puVar1;
  nk_vec2 nVar2;
  uint uVar3;
  nk_buffer *pnVar4;
  void *pvVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  int iVar12;
  void *pvVar13;
  nk_draw_index *pnVar14;
  undefined8 *puVar15;
  long lVar16;
  nk_draw_index nVar17;
  ulong uVar18;
  ulong uVar19;
  nk_size nVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  nk_draw_index nVar25;
  float fVar26;
  nk_draw_index nVar27;
  nk_draw_index nVar28;
  ulong uVar29;
  ulong uVar30;
  nk_draw_index nVar31;
  nk_size nVar32;
  bool bVar33;
  nk_vec2 pos;
  nk_vec2 pos_00;
  nk_vec2 pos_01;
  nk_vec2 pos_02;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar40;
  float fVar42;
  float fVar43;
  float fVar44;
  nk_colorf color_00;
  nk_colorf color_01;
  nk_colorf color_02;
  nk_colorf color_03;
  nk_colorf color_04;
  nk_colorf color_05;
  nk_colorf color_06;
  nk_colorf color_07;
  nk_colorf color_08;
  nk_colorf color_09;
  nk_colorf color_10;
  
  if (1 < points_count && list != (nk_draw_list *)0x0) {
    config = &list->config;
    fVar34 = (list->config).global_alpha;
    uVar29 = (ulong)points_count;
    uVar22 = points_count - 1;
    uVar19 = (ulong)uVar22;
    uVar30 = uVar29;
    if (closed == NK_STROKE_OPEN) {
      uVar30 = uVar19;
    }
    iVar12 = (int)((float)((int)((float)((uint)color >> 0x18) * fVar34) & 0xff) * fVar34);
    fVar34 = (float)((uint)color & 0xff) * 0.003921569;
    fVar36 = (float)((uint)color >> 8 & 0xff) * 0.003921569;
    uVar18 = (ulong)color._2_2_ & 0xffffffffffff00ff;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar18;
    auVar8[0xc] = (char)((uint)iVar12 >> 0x10);
    auVar9[8] = (char)((uint)iVar12 >> 8);
    auVar9._0_8_ = uVar18;
    auVar9[9] = 0;
    auVar9._10_3_ = auVar8._10_3_;
    auVar11._5_8_ = 0;
    auVar11._0_5_ = auVar9._8_5_;
    auVar10[4] = (char)iVar12;
    auVar10._0_4_ = (int)uVar18;
    auVar10[5] = 0;
    auVar10._6_7_ = SUB137(auVar11 << 0x40,6);
    fVar35 = (float)(int)uVar18 * 0.003921569;
    fVar37 = (float)auVar10._4_4_ * 0.003921569;
    uVar3 = list->vertex_count;
    if (aliasing == NK_ANTI_ALIASING_ON) {
      lVar21 = 0xc;
      if (1.0 < thickness) {
        lVar21 = 0x12;
      }
      uVar23 = points_count * 3;
      if (1.0 < thickness) {
        uVar23 = points_count * 4;
      }
      pvVar13 = nk_draw_list_alloc_vertices(list,(ulong)uVar23);
      pnVar14 = nk_draw_list_alloc_elements(list,lVar21 * uVar30);
      if ((pvVar13 != (void *)0x0) && (pnVar14 != (nk_draw_index *)0x0)) {
        pnVar4 = list->vertices;
        if (pnVar4 != (nk_buffer *)0x0) {
          pnVar4->marker[0].active = 1;
          pnVar4->marker[0].offset = pnVar4->allocated;
        }
        pvVar5 = (pnVar4->memory).ptr;
        puVar15 = (undefined8 *)
                  nk_buffer_alloc(pnVar4,NK_BUFFER_FRONT,
                                  ((ulong)(1.0 < thickness) * 0x10 + 0x18) * uVar29,4);
        if (puVar15 != (undefined8 *)0x0) {
          pvVar13 = (void *)((long)pvVar13 + ((long)(list->vertices->memory).ptr - (long)pvVar5));
          if (uVar30 != 0) {
            uVar18 = 1;
            do {
              uVar24 = uVar18;
              if (uVar29 == uVar18) {
                uVar24 = 0;
              }
              fVar43 = points[uVar24].x - points[uVar18 - 1].x;
              fVar42 = points[uVar24].y - points[uVar18 - 1].y;
              fVar44 = fVar43 * fVar43 + fVar42 * fVar42;
              fVar26 = 1.0;
              if ((fVar44 != 0.0) || (NAN(fVar44))) {
                fVar26 = (float)(0x5f375a84 - ((uint)fVar44 >> 1));
                fVar26 = (fVar44 * -0.5 * fVar26 * fVar26 + 1.5) * fVar26;
              }
              puVar15[uVar18 - 1] = CONCAT44(fVar26 * -fVar43,fVar26 * fVar42);
              bVar33 = uVar18 != uVar30;
              uVar18 = uVar18 + 1;
            } while (bVar33);
          }
          if (closed == NK_STROKE_OPEN) {
            puVar15[uVar19] = puVar15[points_count - 2];
          }
          puVar1 = puVar15 + uVar29;
          if (thickness <= 1.0) {
            if (closed == NK_STROKE_OPEN) {
              *puVar1 = CONCAT44((*points).y + (float)((ulong)*puVar15 >> 0x20),
                                 (*points).x + (float)*puVar15);
              puVar1[1] = CONCAT44((*points).y - (float)((ulong)*puVar15 >> 0x20),
                                   (*points).x - (float)*puVar15);
              fVar26 = (float)puVar15[uVar19];
              fVar42 = (float)((ulong)puVar15[uVar19] >> 0x20);
              puVar1[uVar22 * 2] = CONCAT44(points[uVar19].y + fVar42,points[uVar19].x + fVar26);
              puVar1[(ulong)(uVar22 * 2) + 1] =
                   CONCAT44(points[uVar19].y - fVar42,points[uVar19].x - fVar26);
            }
            if (uVar30 != 0) {
              uVar19 = 1;
              uVar22 = uVar3;
              do {
                uVar23 = uVar22 + 3;
                uVar18 = uVar19;
                if (uVar29 == uVar19) {
                  uVar23 = uVar3;
                  uVar18 = 0;
                }
                fVar26 = ((float)puVar15[uVar18] + (float)puVar15[uVar19 - 1]) * 0.5;
                fVar42 = ((float)((ulong)puVar15[uVar18] >> 0x20) +
                         (float)((ulong)puVar15[uVar19 - 1] >> 0x20)) * 0.5;
                fVar43 = fVar26 * fVar26 + fVar42 * fVar42;
                if (1e-06 < fVar43) {
                  fVar43 = 1.0 / fVar43;
                  fVar44 = 100.0;
                  if (fVar43 <= 100.0) {
                    fVar44 = fVar43;
                  }
                  fVar26 = fVar26 * fVar44;
                  fVar42 = fVar42 * fVar44;
                }
                puVar1[uVar18 * 2] = CONCAT44(points[uVar18].y + fVar42,points[uVar18].x + fVar26);
                puVar1[uVar18 * 2 + 1] =
                     CONCAT44(points[uVar18].y - fVar42,points[uVar18].x - fVar26);
                nVar17 = (nk_draw_index)uVar23;
                *pnVar14 = nVar17;
                nVar25 = (nk_draw_index)uVar22;
                pnVar14[1] = nVar25;
                pnVar14[2] = nVar25 + 2;
                pnVar14[3] = nVar25 + 2;
                pnVar14[4] = nVar17 + 2;
                pnVar14[5] = nVar17;
                pnVar14[6] = nVar17 + 1;
                pnVar14[7] = nVar25 + 1;
                pnVar14[8] = nVar25;
                pnVar14[9] = nVar25;
                pnVar14[10] = nVar17;
                pnVar14[0xb] = nVar17 + 1;
                pnVar14 = pnVar14 + 0xc;
                bVar33 = uVar19 != uVar30;
                uVar19 = uVar19 + 1;
                uVar22 = uVar23;
              } while (bVar33);
            }
            if (points_count != 0) {
              lVar21 = 0;
              do {
                nVar2 = (list->config).null.uv;
                color_08.g = fVar36;
                color_08.r = fVar34;
                color_08.a = fVar37;
                color_08.b = fVar35;
                pvVar13 = nk_draw_vertex(pvVar13,config,*(nk_vec2 *)((long)&points->x + lVar21),
                                         nVar2,color_08);
                color_09.g = fVar36;
                color_09.r = fVar34;
                color_09.b = fVar35;
                color_09.a = 0.0;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 * 2 + uVar29 * 8),nVar2
                                         ,color_09);
                color_10.g = fVar36;
                color_10.r = fVar34;
                color_10.b = fVar35;
                color_10.a = 0.0;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 * 2 + uVar29 * 8 + 8),
                                         nVar2,color_10);
                lVar21 = lVar21 + 8;
              } while (uVar29 << 3 != lVar21);
            }
          }
          else {
            fVar26 = (thickness + -1.0) * 0.5;
            if (closed == NK_STROKE_OPEN) {
              fVar42 = fVar26 + 1.0;
              fVar43 = (float)*puVar15;
              fVar39 = fVar42 * fVar43;
              fVar44 = (float)((ulong)*puVar15 >> 0x20);
              fVar41 = fVar42 * fVar44;
              *puVar1 = CONCAT44((*points).y + fVar41,(*points).x + fVar39);
              fVar43 = fVar43 * fVar26;
              fVar44 = fVar44 * fVar26;
              puVar1[1] = CONCAT44((*points).y + fVar44,(*points).x + fVar43);
              puVar1[2] = CONCAT44((*points).y - fVar44,(*points).x - fVar43);
              puVar1[3] = CONCAT44((*points).y - fVar41,(*points).x - fVar39);
              uVar18 = (ulong)(uVar22 * 4);
              fVar44 = (float)puVar15[uVar19];
              fVar43 = fVar42 * fVar44;
              fVar39 = (float)((ulong)puVar15[uVar19] >> 0x20);
              fVar42 = fVar42 * fVar39;
              puVar1[uVar18] = CONCAT44(points[uVar19].y + fVar42,points[uVar19].x + fVar43);
              fVar44 = fVar26 * fVar44;
              fVar39 = fVar26 * fVar39;
              puVar1[uVar18 + 1] = CONCAT44(points[uVar19].y + fVar39,points[uVar19].x + fVar44);
              puVar1[uVar18 + 2] = CONCAT44(points[uVar19].y - fVar39,points[uVar19].x - fVar44);
              puVar1[uVar18 + 3] = CONCAT44(points[uVar19].y - fVar42,points[uVar19].x - fVar43);
            }
            if (uVar30 != 0) {
              uVar19 = 1;
              uVar22 = uVar3;
              do {
                uVar23 = uVar22 + 4;
                uVar18 = uVar19;
                if (uVar29 == uVar19) {
                  uVar23 = uVar3;
                  uVar18 = 0;
                }
                fVar42 = ((float)puVar15[uVar18] + (float)puVar15[uVar19 - 1]) * 0.5;
                fVar43 = ((float)((ulong)puVar15[uVar18] >> 0x20) +
                         (float)((ulong)puVar15[uVar19 - 1] >> 0x20)) * 0.5;
                fVar44 = fVar42 * fVar42 + fVar43 * fVar43;
                if (1e-06 < fVar44) {
                  fVar44 = 1.0 / fVar44;
                  fVar39 = 100.0;
                  if (fVar44 <= 100.0) {
                    fVar39 = fVar44;
                  }
                  fVar42 = fVar42 * fVar39;
                  fVar43 = fVar43 * fVar39;
                }
                fVar44 = (fVar26 + 1.0) * fVar42;
                fVar39 = (fVar26 + 1.0) * fVar43;
                puVar1[uVar18 * 4] = CONCAT44(points[uVar18].y + fVar39,points[uVar18].x + fVar44);
                puVar1[uVar18 * 4 + 1] =
                     CONCAT44(points[uVar18].y + fVar43 * fVar26,points[uVar18].x + fVar42 * fVar26)
                ;
                puVar1[uVar18 * 4 + 2] =
                     CONCAT44(points[uVar18].y - fVar43 * fVar26,points[uVar18].x - fVar42 * fVar26)
                ;
                puVar1[uVar18 * 4 + 3] =
                     CONCAT44(points[uVar18].y - fVar39,points[uVar18].x - fVar44);
                nVar17 = (nk_draw_index)uVar23;
                nVar27 = nVar17 + 1;
                *pnVar14 = nVar27;
                nVar25 = (nk_draw_index)uVar22;
                pnVar14[1] = nVar25 + 1;
                nVar28 = nVar25 + 2;
                pnVar14[2] = nVar28;
                pnVar14[3] = nVar28;
                nVar31 = nVar17 + 2;
                pnVar14[4] = nVar31;
                pnVar14[5] = nVar27;
                pnVar14[6] = nVar27;
                pnVar14[7] = nVar25 + 1;
                pnVar14[8] = nVar25;
                pnVar14[9] = nVar25;
                pnVar14[10] = nVar17;
                pnVar14[0xb] = nVar27;
                pnVar14[0xc] = nVar31;
                pnVar14[0xd] = nVar28;
                pnVar14[0xe] = nVar25 + 3;
                pnVar14[0xf] = nVar25 + 3;
                pnVar14[0x10] = nVar17 + 3;
                pnVar14[0x11] = nVar31;
                pnVar14 = pnVar14 + 0x12;
                bVar33 = uVar19 != uVar30;
                uVar19 = uVar19 + 1;
                uVar22 = uVar23;
              } while (bVar33);
            }
            if (points_count != 0) {
              lVar21 = 0;
              do {
                nVar2 = (list->config).null.uv;
                color_00.g = fVar36;
                color_00.r = fVar34;
                color_00.b = fVar35;
                color_00.a = 0.0;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 + uVar29 * 8),nVar2,
                                         color_00);
                color_01.g = fVar36;
                color_01.r = fVar34;
                color_01.a = fVar37;
                color_01.b = fVar35;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 + uVar29 * 8 + 8),nVar2
                                         ,color_01);
                color_02.g = fVar36;
                color_02.r = fVar34;
                color_02.a = fVar37;
                color_02.b = fVar35;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 + uVar29 * 8 + 0x10),
                                         nVar2,color_02);
                color_03.g = fVar36;
                color_03.r = fVar34;
                color_03.b = fVar35;
                color_03.a = 0.0;
                pvVar13 = nk_draw_vertex(pvVar13,config,
                                         *(nk_vec2 *)((long)puVar15 + lVar21 + uVar29 * 8 + 0x18),
                                         nVar2,color_03);
                lVar21 = lVar21 + 0x20;
              } while (uVar29 << 5 != lVar21);
            }
          }
          pnVar4 = list->vertices;
          if (pnVar4 != (nk_buffer *)0x0) {
            nVar32 = pnVar4->marker[0].offset;
            pnVar4->needed = pnVar4->needed + (nVar32 - pnVar4->allocated);
            nVar20 = 0;
            if (pnVar4->marker[0].active != 0) {
              nVar20 = nVar32;
            }
            pnVar4->allocated = nVar20;
            pnVar4->marker[0].active = 0;
          }
        }
      }
    }
    else {
      pvVar13 = nk_draw_list_alloc_vertices(list,uVar30 * 4);
      pnVar14 = nk_draw_list_alloc_elements(list,uVar30 * 6);
      if ((uVar30 != 0 && pvVar13 != (void *)0x0) && pnVar14 != (nk_draw_index *)0x0) {
        lVar21 = 1;
        nVar32 = 0;
        do {
          lVar16 = 0;
          if (uVar29 * 4 - 4 != nVar32) {
            lVar16 = lVar21;
          }
          fVar26 = *(float *)((long)&points->x + nVar32 * 2);
          fVar42 = *(float *)((long)&points->y + nVar32 * 2);
          fVar43 = points[lVar16].x;
          fVar44 = points[lVar16].y;
          fVar38 = fVar43 - fVar26;
          fVar40 = fVar44 - fVar42;
          fVar41 = fVar38 * fVar38 + fVar40 * fVar40;
          fVar39 = 1.0;
          if ((fVar41 != 0.0) || (NAN(fVar41))) {
            fVar39 = (float)(0x5f375a84 - ((uint)fVar41 >> 1));
            fVar39 = (fVar41 * -0.5 * fVar39 * fVar39 + 1.5) * fVar39;
          }
          nVar2 = (list->config).null.uv;
          fVar41 = fVar38 * fVar39 * thickness * 0.5;
          fVar39 = fVar40 * fVar39 * thickness * 0.5;
          pos.x = fVar26 + fVar39;
          pos.y = fVar42 - fVar41;
          color_04.g = fVar36;
          color_04.r = fVar34;
          color_04.a = fVar37;
          color_04.b = fVar35;
          pvVar13 = nk_draw_vertex(pvVar13,config,pos,nVar2,color_04);
          pos_00.x = fVar43 + fVar39;
          pos_00.y = fVar44 - fVar41;
          color_05.g = fVar36;
          color_05.r = fVar34;
          color_05.a = fVar37;
          color_05.b = fVar35;
          pvVar13 = nk_draw_vertex(pvVar13,config,pos_00,nVar2,color_05);
          pos_01.x = fVar43 - fVar39;
          pos_01.y = fVar44 + fVar41;
          color_06.g = fVar36;
          color_06.r = fVar34;
          color_06.a = fVar37;
          color_06.b = fVar35;
          pvVar13 = nk_draw_vertex(pvVar13,config,pos_01,nVar2,color_06);
          pos_02.x = fVar26 - fVar39;
          pos_02.y = fVar41 + fVar42;
          color_07.g = fVar36;
          color_07.r = fVar34;
          color_07.a = fVar37;
          color_07.b = fVar35;
          pvVar13 = nk_draw_vertex(pvVar13,config,pos_02,nVar2,color_07);
          sVar6 = (short)uVar3;
          sVar7 = (short)nVar32;
          *pnVar14 = sVar6 + sVar7;
          pnVar14[1] = sVar6 + sVar7 + 1;
          nVar17 = sVar6 + 2 + sVar7;
          pnVar14[2] = nVar17;
          pnVar14[3] = sVar6 + sVar7;
          pnVar14[4] = nVar17;
          pnVar14[5] = sVar6 + sVar7 + 3;
          pnVar14 = pnVar14 + 6;
          nVar32 = nVar32 + 4;
          lVar21 = lVar21 + 1;
        } while (uVar30 * 4 != nVar32);
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_poly_line(struct nk_draw_list *list, const struct nk_vec2 *points,
const unsigned int points_count, struct nk_color color, enum nk_draw_list_stroke closed,
float thickness, enum nk_anti_aliasing aliasing)
{
nk_size count;
int thick_line;
struct nk_colorf col;
struct nk_colorf col_trans;
NK_ASSERT(list);
if (!list || points_count < 2) return;

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
count = points_count;
if (!closed) count = points_count-1;
thick_line = thickness > 1.0f;

#ifdef NK_INCLUDE_COMMAND_USERDATA
nk_draw_list_push_userdata(list, list->userdata);
#endif

color.a = (nk_byte)((float)color.a * list->config.global_alpha);
nk_color_fv(&col.r, color);
col_trans = col;
col_trans.a = 0;

if (aliasing == NK_ANTI_ALIASING_ON) {
/* ANTI-ALIASED STROKE */
const float AA_SIZE = 1.0f;
NK_STORAGE const nk_size pnt_align = NK_ALIGNOF(struct nk_vec2);
NK_STORAGE const nk_size pnt_size = sizeof(struct nk_vec2);

/* allocate vertices and elements  */
nk_size i1 = 0;
nk_size vertex_offset;
nk_size index = list->vertex_count;

const nk_size idx_count = (thick_line) ?  (count * 18) : (count * 12);
const nk_size vtx_count = (thick_line) ? (points_count * 4): (points_count *3);

void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);

nk_size size;
struct nk_vec2 *normals, *temp;
if (!vtx || !ids) return;

/* temporary allocate normals + points */
vertex_offset = (nk_size)((nk_byte*)vtx - (nk_byte*)list->vertices->memory.ptr);
nk_buffer_mark(list->vertices, NK_BUFFER_FRONT);
size = pnt_size * ((thick_line) ? 5 : 3) * points_count;
normals = (struct nk_vec2*) nk_buffer_alloc(list->vertices, NK_BUFFER_FRONT, size, pnt_align);
if (!normals) return;
temp = normals + points_count;

/* make sure vertex pointer is still correct */
vtx = (void*)((nk_byte*)list->vertices->memory.ptr + vertex_offset);

/* calculate normals */
for (i1 = 0; i1 < count; ++i1) {
const nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
struct nk_vec2 diff = nk_vec2_sub(points[i2], points[i1]);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;

diff = nk_vec2_muls(diff, len);
normals[i1].x = diff.y;
normals[i1].y = -diff.x;
}

if (!closed)
normals[points_count-1] = normals[points_count-2];

if (!thick_line) {
nk_size idx1, i;
if (!closed) {
struct nk_vec2 d;
temp[0] = nk_vec2_add(points[0], nk_vec2_muls(normals[0], AA_SIZE));
temp[1] = nk_vec2_sub(points[0], nk_vec2_muls(normals[0], AA_SIZE));
d = nk_vec2_muls(normals[points_count-1], AA_SIZE);
temp[(points_count-1) * 2 + 0] = nk_vec2_add(points[points_count-1], d);
temp[(points_count-1) * 2 + 1] = nk_vec2_sub(points[points_count-1], d);
}

/* fill elements */
idx1 = index;
for (i1 = 0; i1 < count; i1++) {
struct nk_vec2 dm;
float dmr2;
nk_size i2 = ((i1 + 1) == points_count) ? 0 : (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 3);

/* average normals */
dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm = nk_vec2_muls(dm, AA_SIZE);
temp[i2*2+0] = nk_vec2_add(points[i2], dm);
temp[i2*2+1] = nk_vec2_sub(points[i2], dm);

ids[0] = (nk_draw_index)(idx2 + 0); ids[1] = (nk_draw_index)(idx1+0);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+0);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11]= (nk_draw_index)(idx2+1);
ids += 12;
idx1 = idx2;
}

/* fill vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, points[i], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*2+1], uv, col_trans);
}
} else {
nk_size idx1, i;
const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;
if (!closed) {
struct nk_vec2 d1 = nk_vec2_muls(normals[0], half_inner_thickness + AA_SIZE);
struct nk_vec2 d2 = nk_vec2_muls(normals[0], half_inner_thickness);

temp[0] = nk_vec2_add(points[0], d1);
temp[1] = nk_vec2_add(points[0], d2);
temp[2] = nk_vec2_sub(points[0], d2);
temp[3] = nk_vec2_sub(points[0], d1);

d1 = nk_vec2_muls(normals[points_count-1], half_inner_thickness + AA_SIZE);
d2 = nk_vec2_muls(normals[points_count-1], half_inner_thickness);

temp[(points_count-1)*4+0] = nk_vec2_add(points[points_count-1], d1);
temp[(points_count-1)*4+1] = nk_vec2_add(points[points_count-1], d2);
temp[(points_count-1)*4+2] = nk_vec2_sub(points[points_count-1], d2);
temp[(points_count-1)*4+3] = nk_vec2_sub(points[points_count-1], d1);
}

/* add all elements */
idx1 = index;
for (i1 = 0; i1 < count; ++i1) {
struct nk_vec2 dm_out, dm_in;
const nk_size i2 = ((i1+1) == points_count) ? 0: (i1 + 1);
nk_size idx2 = ((i1+1) == points_count) ? index: (idx1 + 4);

/* average normals */
struct nk_vec2 dm = nk_vec2_muls(nk_vec2_add(normals[i1], normals[i2]), 0.5f);
float dmr2 = dm.x * dm.x + dm.y* dm.y;
if (dmr2 > 0.000001f) {
float scale = 1.0f/dmr2;
scale = NK_MIN(100.0f, scale);
dm = nk_vec2_muls(dm, scale);
}

dm_out = nk_vec2_muls(dm, ((half_inner_thickness) + AA_SIZE));
dm_in = nk_vec2_muls(dm, half_inner_thickness);
temp[i2*4+0] = nk_vec2_add(points[i2], dm_out);
temp[i2*4+1] = nk_vec2_add(points[i2], dm_in);
temp[i2*4+2] = nk_vec2_sub(points[i2], dm_in);
temp[i2*4+3] = nk_vec2_sub(points[i2], dm_out);

/* add indexes */
ids[0] = (nk_draw_index)(idx2 + 1); ids[1] = (nk_draw_index)(idx1+1);
ids[2] = (nk_draw_index)(idx1 + 2); ids[3] = (nk_draw_index)(idx1+2);
ids[4] = (nk_draw_index)(idx2 + 2); ids[5] = (nk_draw_index)(idx2+1);
ids[6] = (nk_draw_index)(idx2 + 1); ids[7] = (nk_draw_index)(idx1+1);
ids[8] = (nk_draw_index)(idx1 + 0); ids[9] = (nk_draw_index)(idx1+0);
ids[10]= (nk_draw_index)(idx2 + 0); ids[11] = (nk_draw_index)(idx2+1);
ids[12]= (nk_draw_index)(idx2 + 2); ids[13] = (nk_draw_index)(idx1+2);
ids[14]= (nk_draw_index)(idx1 + 3); ids[15] = (nk_draw_index)(idx1+3);
ids[16]= (nk_draw_index)(idx2 + 3); ids[17] = (nk_draw_index)(idx2+2);
ids += 18;
idx1 = idx2;
}

/* add vertices */
for (i = 0; i < points_count; ++i) {
const struct nk_vec2 uv = list->config.null.uv;
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+0], uv, col_trans);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+1], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+2], uv, col);
vtx = nk_draw_vertex(vtx, &list->config, temp[i*4+3], uv, col_trans);
}
}
/* free temporary normals + points */
nk_buffer_reset(list->vertices, NK_BUFFER_FRONT);
} else {
/* NON ANTI-ALIASED STROKE */
nk_size i1 = 0;
nk_size idx = list->vertex_count;
const nk_size idx_count = count * 6;
const nk_size vtx_count = count * 4;
void *vtx = nk_draw_list_alloc_vertices(list, vtx_count);
nk_draw_index *ids = nk_draw_list_alloc_elements(list, idx_count);
if (!vtx || !ids) return;

for (i1 = 0; i1 < count; ++i1) {
float dx, dy;
const struct nk_vec2 uv = list->config.null.uv;
const nk_size i2 = ((i1+1) == points_count) ? 0 : i1 + 1;
const struct nk_vec2 p1 = points[i1];
const struct nk_vec2 p2 = points[i2];
struct nk_vec2 diff = nk_vec2_sub(p2, p1);
float len;

/* vec2 inverted length  */
len = nk_vec2_len_sqr(diff);
if (len != 0.0f)
len = nk_inv_sqrt(len);
else len = 1.0f;
diff = nk_vec2_muls(diff, len);

/* add vertices */
dx = diff.x * (thickness * 0.5f);
dy = diff.y * (thickness * 0.5f);

vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x + dy, p1.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x + dy, p2.y - dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p2.x - dy, p2.y + dx), uv, col);
vtx = nk_draw_vertex(vtx, &list->config, nk_vec2(p1.x - dy, p1.y + dx), uv, col);

ids[0] = (nk_draw_index)(idx+0); ids[1] = (nk_draw_index)(idx+1);
ids[2] = (nk_draw_index)(idx+2); ids[3] = (nk_draw_index)(idx+0);
ids[4] = (nk_draw_index)(idx+2); ids[5] = (nk_draw_index)(idx+3);

ids += 6;
idx += 4;
}
}
}